

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::replace
          (Generator *this,string *child_name,shared_ptr<kratos::Generator> *new_child)

{
  allocator<kratos::IRNode_*> *this_00;
  size_t *psVar1;
  pointer *this_01;
  allocator<const_kratos::IRNode_*> *this_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  initializer_list<const_kratos::IRNode_*> __l_03;
  initializer_list<kratos::IRNode_*> __l_04;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<kratos::Generator> *psVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  PortType PVar7;
  PortType PVar8;
  PortDirection PVar9;
  PortDirection PVar10;
  GeneratorException *this_03;
  mapped_type *pmVar11;
  element_type *peVar12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar13;
  size_type sVar14;
  size_type sVar15;
  VarException *pVVar16;
  element_type *peVar17;
  iterator begin;
  iterator end;
  element_type *peVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__y;
  bool *pbVar19;
  element_type *peVar20;
  element_type *peVar21;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  allocator<const_kratos::IRNode_*> local_871;
  element_type *local_870;
  element_type *local_868;
  element_type **local_860;
  size_type local_858;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_850;
  _Rb_tree_node_base local_838;
  undefined1 local_812;
  allocator<const_kratos::IRNode_*> local_811;
  element_type *local_810;
  element_type *local_808;
  element_type **local_800;
  size_type local_7f8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_7f0;
  undefined1 local_7d8 [40];
  element_type *local_7b0;
  element_type *local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_7a0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_790;
  _Rb_tree_node_base local_778;
  undefined1 local_752;
  allocator<const_kratos::IRNode_*> local_751;
  element_type *local_750;
  element_type *local_748;
  element_type **local_740;
  _Base_ptr local_738;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_730;
  undefined1 local_718 [32];
  undefined1 local_6f8 [8];
  shared_ptr<kratos::Port> new_port;
  shared_ptr<kratos::Port> old_port;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [48];
  _Rb_tree_node_base local_690;
  undefined1 local_670 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name_2;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_628;
  undefined1 local_608 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  element_type *local_5c0;
  pointer local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_> ports;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_port_names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_port_names;
  mapped_type old_child;
  Generator *local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_500;
  _Base_ptr local_4f0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_4e8;
  string local_4c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
  local_4a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
  local_498;
  _Base_ptr local_490;
  shared_ptr<kratos::Generator> *new_child_local;
  string *child_name_local;
  Generator *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_470;
  basic_string_view<char> local_468;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  __node_base local_430;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  _Base_ptr local_420;
  __buckets_ptr local_418;
  string *local_410;
  __node_base local_408;
  Generator *local_400;
  _Prime_rehash_policy local_3f8;
  _Rb_tree_node_base local_3e8;
  _Rb_tree_node_base *local_3c0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  __node_base local_3b0;
  _Base_ptr local_3a8;
  __node_base local_3a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_398;
  _Prime_rehash_policy local_388;
  undefined1 local_378 [48];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  undefined1 local_340 [16];
  _Rb_tree_node_base *local_330;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_328;
  _Prime_rehash_policy local_318;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  __node_base local_2d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  _Base_ptr local_2c8;
  _Base_ptr local_2c0;
  __node_base local_2b8;
  Generator *local_2b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2a8;
  basic_string_view<char> local_298;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  _Base_ptr local_258;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  _Base_ptr local_248;
  __node_base local_240;
  _Base_ptr local_238;
  _Rb_tree_node_base *local_230;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_228;
  basic_string_view<char> local_218;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  __node_base local_1d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_5;
  _Base_ptr local_1c8;
  __node_base local_1c0;
  __node_base_ptr local_1b8;
  ModuleInstantiationStmt *local_1b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1a8;
  _Prime_rehash_policy local_198;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_150;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_6;
  _Base_ptr local_140;
  _Base_ptr local_138;
  _Base_ptr local_130;
  _Rb_tree_node_base *local_128;
  _Rb_tree_node_base *local_120;
  _Base_ptr local_118;
  __node_base local_110;
  _Base_ptr local_108;
  _Rb_tree_node_base *local_100;
  _Base_ptr local_f8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_f0;
  ModuleInstantiationStmt *local_e8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_e0;
  __node_base local_d8;
  __node_base local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c8;
  ModuleInstantiationStmt *local_c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b8;
  ModuleInstantiationStmt *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  __node_base local_98;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_90;
  _Base_ptr local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_70;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  _Base_ptr local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  _Base_ptr local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_490 = (_Base_ptr)new_child;
  new_child_local = (shared_ptr<kratos::Generator> *)child_name;
  child_name_local = (string *)this;
  local_498._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
       ::find(&this->children_,child_name);
  local_4a0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
       ::end(&this->children_);
  bVar4 = std::__detail::operator==(&local_498,&local_4a0);
  if (bVar4) {
    old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _6_1_ = 1;
    this_03 = (GeneratorException *)__cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&this->instance_name;
    local_410 = &local_4c0;
    local_418 = (__buckets_ptr)0x4289fc;
    local_420 = (_Base_ptr)new_child_local;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[28],char>
              (&local_458,(v7 *)"Unable to find {0} from {1}",(char (*) [28])new_child_local,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_430._M_nxt = (_Hash_node_base *)&local_458;
    local_468 = fmt::v7::to_string_view<char,_0>((char *)local_418);
    local_f0 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_f8 = (_Base_ptr)local_430._M_nxt;
    local_e8 = (ModuleInstantiationStmt *)local_430._M_nxt;
    local_d8._M_nxt = local_430._M_nxt;
    local_e0 = local_f0;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_f0,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_430._M_nxt);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_468.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_470.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_4c0,(detail *)local_468.data_,format_str,args);
    local_508 = this;
    local_500._M_allocated_capacity =
         (size_type)
         std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)local_490);
    local_500._8_8_ = &local_508;
    local_4f0 = (_Base_ptr)0x2;
    this_00 = (allocator<kratos::IRNode_*> *)
              ((long)&old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7);
    std::allocator<kratos::IRNode_*>::allocator(this_00);
    __l_04._M_len = (size_type)local_4f0;
    __l_04._M_array = (iterator)local_500._8_8_;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_4e8,__l_04,this_00);
    GeneratorException::GeneratorException(this_03,&local_4c0,&local_4e8);
    old_child.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _6_1_ = 0;
    __cxa_throw(this_03,&GeneratorException::typeinfo,GeneratorException::~GeneratorException);
  }
  pmVar11 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
            ::at(&this->children_,(key_type *)new_child_local);
  std::shared_ptr<kratos::Generator>::shared_ptr
            ((shared_ptr<kratos::Generator> *)
             &old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,pmVar11);
  psVar3 = new_child_local;
  peVar12 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_490);
  std::__cxx11::string::operator=((string *)&peVar12->instance_name,(string *)psVar3);
  peVar12 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
  psVar13 = get_port_names_abi_cxx11_(peVar12);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar13);
  peVar12 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_490);
  psVar13 = get_port_names_abi_cxx11_(peVar12);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage,psVar13);
  sVar14 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar15 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ports.
                      super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar14 != sVar15) {
    std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>::vector
              ((vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_> *)&__range2);
    sVar14 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    sVar15 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ports.
                        super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>::reserve
              ((vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_> *)&__range2,
               sVar14 + sVar15);
    psVar1 = &new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)psVar1);
    port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)psVar1);
    while (bVar4 = std::operator!=(&__end2,(_Self *)&port_name), bVar4) {
      local_5b8 = (pointer)std::
                           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&__end2);
      peVar12 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      get_port((Generator *)&__range2_1,(string *)peVar12);
      local_5c0 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&__range2_1);
      std::vector<kratos::Var_const*,std::allocator<kratos::Var_const*>>::
      emplace_back<kratos::Port*>
                ((vector<kratos::Var_const*,std::allocator<kratos::Var_const*>> *)&__range2,
                 &local_5c0);
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&__range2_1);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    this_01 = &ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2_1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_01);
    port_name_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_01);
    while (bVar4 = std::operator!=(&__end2_1,(_Self *)&port_name_1), bVar4) {
      local_608._24_8_ =
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end2_1);
      peVar12 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_490);
      get_port((Generator *)local_608,(string *)peVar12);
      local_608._16_8_ =
           std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_608);
      std::vector<kratos::Var_const*,std::allocator<kratos::Var_const*>>::
      emplace_back<kratos::Port*>
                ((vector<kratos::Var_const*,std::allocator<kratos::Var_const*>> *)&__range2,
                 (Port **)(local_608 + 0x10));
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_608);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
    pVVar16 = (VarException *)__cxa_allocate_exception(0x10);
    peVar12 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    peVar17 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_490);
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&peVar17->name;
    local_3a0._M_nxt = (_Hash_node_base *)&local_628;
    local_3a8 = (_Base_ptr)0x428ed1;
    local_3b0._M_nxt = (_Hash_node_base *)&peVar12->name;
    fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[44],char>
              ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_3e8,(v7 *)"{0}\'s port interface doesn\'t match with {1}",
               (char (*) [44])&peVar12->name,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs_1,in_R8);
    local_3c0 = &local_3e8;
    local_3f8 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>((char *)local_3a8);
    local_118 = (_Base_ptr)&local_408;
    local_120 = local_3c0;
    local_110._M_nxt = (_Hash_node_base *)local_3c0;
    local_100 = local_3c0;
    local_108 = local_118;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_118,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_3c0);
    format_str_00.size_ = (size_t)local_408._M_nxt;
    format_str_00.data_ = (char *)local_3f8._M_next_resize;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_400;
    fmt::v7::detail::vformat_abi_cxx11_(&local_628,(detail *)local_3f8._0_8_,format_str_00,args_00);
    begin = std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>::begin
                      ((vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_> *)
                       &__range2);
    end = std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>::end
                    ((vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_> *)&__range2)
    ;
    VarException::VarException(pVVar16,&local_628,begin,end);
    __cxa_throw(pVVar16,&VarException::typeinfo,VarException::~VarException);
  }
  psVar1 = &new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
  port_name_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)psVar1);
  while( true ) {
    bVar4 = std::operator!=(&__end1,(_Self *)&port_name_2);
    if (!bVar4) {
      remove_child_generator
                (this,(shared_ptr<kratos::Generator> *)
                      &old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      add_child_generator(this,(string *)new_child_local,(shared_ptr<kratos::Generator> *)local_490)
      ;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ports.super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&new_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::shared_ptr<kratos::Generator>::~shared_ptr
                ((shared_ptr<kratos::Generator> *)
                 &old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    local_660._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1);
    local_670._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ports.
                    super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)local_660._M_pi);
    local_670._0_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ports.
                   super__Vector_base<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar4 = std::operator==((_Self *)(local_670 + 8),(_Self *)local_670);
    if (bVar4) {
      old_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
           = 1;
      pVVar16 = (VarException *)__cxa_allocate_exception(0x10);
      peVar12 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_490);
      local_340._0_8_ = &peVar12->name;
      local_330 = &local_690;
      local_340._8_8_ = "{0} doesn\'t have port {1}";
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_660._M_pi;
      fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,char[26],char>
                ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_378,(v7 *)"{0} doesn\'t have port {1}",(char (*) [26])local_340._0_8_,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)local_660._M_pi,in_R8);
      local_378._40_8_ = local_378;
      local_388 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>((char *)local_340._8_8_);
      local_c8 = &local_398;
      local_d0._M_nxt = (_Hash_node_base *)local_378._40_8_;
      local_c0 = (ModuleInstantiationStmt *)local_378._40_8_;
      local_b0 = (ModuleInstantiationStmt *)local_378._40_8_;
      local_b8 = local_c8;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_c8,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_378._40_8_);
      format_str_01.size_ = local_398.desc_;
      format_str_01.data_ = (char *)local_388._M_next_resize;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_398.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&local_690,(detail *)local_388._0_8_,format_str_01,args_01);
      peVar12 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      get_port((Generator *)local_6d0,(string *)peVar12);
      local_6c0._0_8_ =
           std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6d0);
      local_6c0._8_8_ = local_6c0;
      local_6c0._16_8_ = 1;
      this_02 = (allocator<const_kratos::IRNode_*> *)
                ((long)&old_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7);
      std::allocator<const_kratos::IRNode_*>::allocator(this_02);
      __l_03._M_len = local_6c0._16_8_;
      __l_03._M_array = (iterator)local_6c0._8_8_;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 (local_6c0 + 0x18),__l_03,this_02);
      VarException::VarException
                (pVVar16,(string *)&local_690,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 (local_6c0 + 0x18));
      old_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
           = 0;
      __cxa_throw(pVVar16,&VarException::typeinfo,VarException::~VarException);
    }
    peVar12 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    get_port((Generator *)
             &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)peVar12);
    peVar12 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_490);
    get_port((Generator *)local_6f8,(string *)peVar12);
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    __x = Var::size(&peVar18->super_Var);
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_6f8);
    __y = Var::size(&peVar18->super_Var);
    bVar4 = std::operator!=(__x,__y);
    if (bVar4) break;
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    iVar5 = (*(peVar18->super_Var).super_IRNode._vptr_IRNode[7])();
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_6f8);
    iVar6 = (*(peVar18->super_Var).super_IRNode._vptr_IRNode[7])();
    if (iVar5 != iVar6) break;
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    pbVar19 = Var::is_signed(&peVar18->super_Var);
    bVar4 = *pbVar19;
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_6f8);
    pbVar19 = Var::is_signed(&peVar18->super_Var);
    if ((bVar4 & 1U) != (*pbVar19 & 1U)) {
      local_7d8[0x26] = 1;
      pVVar16 = (VarException *)__cxa_allocate_exception(0x10);
      peVar12 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      _Var2._M_pi = local_660._M_pi;
      peVar17 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_490);
      vargs_4 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&peVar17->name;
      local_230 = &local_778;
      local_238 = (_Base_ptr)0x428f45;
      local_248 = (_Base_ptr)_Var2._M_pi;
      local_240._M_nxt = (_Hash_node_base *)&peVar12->name;
      fmt::v7::
      make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,char[45],char>
                (&local_288,(v7 *)"{0}\'s port {1} has different sign than {2}\'s",
                 (char (*) [45])&peVar12->name,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)_Var2._M_pi,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_4,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
      local_258 = (_Base_ptr)&local_288;
      local_298 = fmt::v7::to_string_view<char,_0>((char *)local_238);
      local_80 = &local_2a8;
      local_88 = local_258;
      local_50 = local_258;
      local_40 = local_258;
      local_48 = local_80;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_80,0xddd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_258);
      format_str_03.size_ = local_2a8.desc_;
      format_str_03.data_ = (char *)local_298.size_;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_2a8.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&local_778,(detail *)local_298.data_,format_str_03,args_03);
      local_7b0 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                             &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      local_7a8 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
      local_7a0._M_allocated_capacity = (size_type)&local_7b0;
      local_7a0._8_8_ = 2;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)(local_7d8 + 0x27));
      __l_01._M_len = local_7a0._8_8_;
      __l_01._M_array = (iterator)local_7a0._M_allocated_capacity;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_790,__l_01,(allocator<const_kratos::IRNode_*> *)(local_7d8 + 0x27));
      VarException::VarException(pVVar16,(string *)&local_778,&local_790);
      local_7d8[0x26] = 0;
      __cxa_throw(pVVar16,&VarException::typeinfo,VarException::~VarException);
    }
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    PVar7 = Port::port_type(peVar18);
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_6f8);
    PVar8 = Port::port_type(peVar18);
    if (PVar7 != PVar8) {
      local_812 = 1;
      pVVar16 = (VarException *)__cxa_allocate_exception(0x10);
      peVar12 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      _Var2._M_pi = local_660._M_pi;
      peVar17 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_490);
      vargs_5 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&peVar17->name;
      local_1b0 = (ModuleInstantiationStmt *)local_7d8;
      local_1b8 = (__node_base_ptr)0x428f72;
      local_1c8 = (_Base_ptr)_Var2._M_pi;
      local_1c0._M_nxt = (_Hash_node_base *)&peVar12->name;
      fmt::v7::
      make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,char[50],char>
                (&local_208,(v7 *)"{0}\'s port {1} has different port type than {2}\'s",
                 (char (*) [50])&peVar12->name,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)_Var2._M_pi,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_5,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
      local_1d8._M_nxt = (_Hash_node_base *)&local_208;
      local_218 = fmt::v7::to_string_view<char,_0>((char *)local_1b8);
      local_90 = &local_228;
      local_98._M_nxt = local_1d8._M_nxt;
      local_38 = (_Base_ptr)local_1d8._M_nxt;
      local_28 = (_Base_ptr)local_1d8._M_nxt;
      local_30 = local_90;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_90,0xddd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_1d8._M_nxt);
      format_str_04.size_ = local_228.desc_;
      format_str_04.data_ = (char *)local_218.size_;
      args_04.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_04.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_228.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_7d8,(detail *)local_218.data_,format_str_04,args_04);
      local_810 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                             &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      local_808 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
      local_800 = &local_810;
      local_7f8 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_811);
      __l_00._M_len = local_7f8;
      __l_00._M_array = (iterator)local_800;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_7f0,__l_00,&local_811);
      VarException::VarException(pVVar16,(string *)local_7d8,&local_7f0);
      local_812 = 0;
      __cxa_throw(pVVar16,&VarException::typeinfo,VarException::~VarException);
    }
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    PVar9 = Port::port_direction(peVar18);
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_6f8);
    PVar10 = Port::port_direction(peVar18);
    if (PVar9 != PVar10) {
      pVVar16 = (VarException *)__cxa_allocate_exception(0x10);
      peVar12 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      _Var2._M_pi = local_660._M_pi;
      peVar17 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_490);
      vargs_6 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&peVar17->name;
      local_128 = &local_838;
      local_130 = (_Base_ptr)0x428fa4;
      local_140 = (_Base_ptr)_Var2._M_pi;
      local_138 = (_Base_ptr)&peVar12->name;
      fmt::v7::
      make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,char[55],char>
                (&local_188,(v7 *)"{0}\'s port {1} has different port direction than {2}\'s",
                 (char (*) [55])&peVar12->name,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)_Var2._M_pi,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_6,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
      local_150 = &local_188;
      local_198 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>((char *)local_130);
      local_a0 = &local_1a8;
      local_a8 = local_150;
      local_20 = local_150;
      local_10 = local_150;
      local_18 = local_a0;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_a0,0xddd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_150);
      format_str_05.size_ = local_1a8.desc_;
      format_str_05.data_ = (char *)local_198._M_next_resize;
      args_05.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_05.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_1a8.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&local_838,(detail *)local_198._0_8_,format_str_05,args_05);
      local_870 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                             &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      local_868 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
      local_860 = &local_870;
      local_858 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_871);
      __l._M_len = local_858;
      __l._M_array = (iterator)local_860;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_850,__l,&local_871);
      VarException::VarException(pVVar16,(string *)&local_838,&local_850);
      __cxa_throw(pVVar16,&VarException::typeinfo,VarException::~VarException);
    }
    peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    PVar9 = Port::port_direction(peVar18);
    if (PVar9 == In) {
      peVar20 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                           &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      peVar21 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
      Var::move_src_to(&peVar20->super_Var,&peVar21->super_Var,this,false);
    }
    else {
      peVar18 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
      PVar9 = Port::port_direction(peVar18);
      if (PVar9 == Out) {
        peVar20 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                             &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        peVar21 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
        Var::move_sink_to(&peVar20->super_Var,&peVar21->super_Var,this,false);
      }
      else {
        peVar20 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                             &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        peVar21 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
        Var::move_src_to(&peVar20->super_Var,&peVar21->super_Var,this,false);
        peVar20 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                             &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        peVar21 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
        Var::move_sink_to(&peVar20->super_Var,&peVar21->super_Var,this,false);
      }
    }
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_6f8);
    std::shared_ptr<kratos::Port>::~shared_ptr
              ((shared_ptr<kratos::Port> *)
               &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  local_752 = 1;
  pVVar16 = (VarException *)__cxa_allocate_exception(0x10);
  peVar12 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&old_port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
  _Var2._M_pi = local_660._M_pi;
  peVar17 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_490);
  vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&peVar17->name;
  local_2b0 = (Generator *)local_718;
  local_2b8._M_nxt = (_Hash_node_base *)0x428f17;
  local_2c8 = (_Base_ptr)_Var2._M_pi;
  local_2c0 = (_Base_ptr)&peVar12->name;
  fmt::v7::
  make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,char[46],char>
            (&local_308,(v7 *)"{0}\'s port {1} has different width than {2}\'s",
             (char (*) [46])&peVar12->name,
             (remove_reference_t<std::__cxx11::basic_string<char>_&> *)_Var2._M_pi,
             (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_3,
             (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
  local_2d8._M_nxt = (_Hash_node_base *)&local_308;
  local_318 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>((char *)local_2b8._M_nxt);
  local_70 = &local_328;
  local_78 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d8._M_nxt;
  local_68 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d8._M_nxt;
  local_58 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d8._M_nxt;
  local_60 = local_70;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_70,0xddd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_2d8._M_nxt);
  format_str_02.size_ = local_328.desc_;
  format_str_02.data_ = (char *)local_318._M_next_resize;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_328.field_1.values_;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_718,(detail *)local_318._0_8_,format_str_02,args_02);
  local_750 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                         &new_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  local_748 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_6f8);
  local_740 = &local_750;
  local_738 = (_Base_ptr)0x2;
  std::allocator<const_kratos::IRNode_*>::allocator(&local_751);
  __l_02._M_len = (size_type)local_738;
  __l_02._M_array = (iterator)local_740;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_730,__l_02,&local_751);
  VarException::VarException(pVVar16,(string *)local_718,&local_730);
  local_752 = 0;
  __cxa_throw(pVVar16,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

void Generator::replace(const std::string &child_name,
                        const std::shared_ptr<Generator> &new_child) {
    // obtained the generator
    if (children_.find(child_name) == children_.end()) {
        throw GeneratorException(::format("Unable to find {0} from {1}", child_name, instance_name),
                                 {this, new_child.get()});
    }
    auto old_child = children_.at(child_name);
    new_child->instance_name = child_name;
    // first we need to make sure that the interfaces are the same
    auto old_port_names = old_child->get_port_names();
    auto new_port_names = new_child->get_port_names();
    if (old_port_names.size() != new_port_names.size()) {
        // doesn't match
        // show all the port definitions
        std::vector<const Var *> ports;
        ports.reserve(old_port_names.size() + new_port_names.size());
        for (auto const &port_name : old_port_names) {
            ports.emplace_back(old_child->get_port(port_name).get());
        }
        for (auto const &port_name : new_port_names) {
            ports.emplace_back(new_child->get_port(port_name).get());
        }
        throw VarException(::format("{0}'s port interface doesn't match with {1}", old_child->name,
                                    new_child->name),
                           ports.begin(), ports.end());
    }
    // check the name, type, and size
    for (const auto &port_name : old_port_names) {
        if (new_port_names.find(port_name) == new_port_names.end()) {
            // doesn't have the port
            throw VarException(::format("{0} doesn't have port {1}", new_child->name, port_name),
                               {old_child->get_port(port_name).get()});
        }
        auto old_port = old_child->get_port(port_name);
        auto new_port = new_child->get_port(port_name);
        // type checking
        if (old_port->size() != new_port->size() || old_port->width() != new_port->width()) {
            throw VarException(::format("{0}'s port {1} has different width than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }
        if (old_port->is_signed() != new_port->is_signed()) {
            throw VarException(::format("{0}'s port {1} has different sign than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }
        if (old_port->port_type() != new_port->port_type()) {
            throw VarException(::format("{0}'s port {1} has different port type than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }
        if (old_port->port_direction() != new_port->port_direction()) {
            throw VarException(::format("{0}'s port {1} has different port direction than {2}'s",
                                        old_child->name, port_name, new_child->name),
                               {old_port.get(), new_port.get()});
        }

        // all passed, now replace the port!
        if (old_port->port_direction() == PortDirection::In) {
            // move the src
            Var::move_src_to(old_port.get(), new_port.get(), this, false);
        } else if (old_port->port_direction() == PortDirection::Out) {
            // move the sinks
            Var::move_sink_to(old_port.get(), new_port.get(), this, false);
        } else {
            // inout, move both source and sinks
            Var::move_src_to(old_port.get(), new_port.get(), this, false);
            Var::move_sink_to(old_port.get(), new_port.get(), this, false);
        }
    }

    // update other meta data info
    remove_child_generator(old_child);
    add_child_generator(child_name, new_child);
}